

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O1

Vertex __thiscall embree::OBJLoader::getUInt3(OBJLoader *this,char **token)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  Vertex VVar8;
  
  pcVar1 = *token;
  iVar2 = atoi(pcVar1);
  if (iVar2 < 1) {
    if (iVar2 == 0) {
      uVar4 = 0;
    }
    else {
      uVar4 = iVar2 + (int)(this->v).size_active;
    }
  }
  else {
    uVar4 = iVar2 - 1;
  }
  sVar3 = strcspn(pcVar1,"/ \t\r");
  pcVar7 = pcVar1 + sVar3;
  *token = pcVar7;
  uVar5 = 0xffffffff;
  if (pcVar1[sVar3] != '/') {
    uVar6 = 0xffffffff;
    goto LAB_0013f7ea;
  }
  pcVar1 = pcVar7 + 1;
  *token = pcVar1;
  if (pcVar7[1] == '/') {
    pcVar7 = pcVar7 + 2;
    *token = pcVar7;
    iVar2 = atoi(pcVar7);
    if (iVar2 < 1) {
      uVar6 = 0xffffffff;
joined_r0x0013f7c8:
      if (iVar2 == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = iVar2 + (int)(this->vn).size_active;
      }
    }
    else {
      uVar5 = iVar2 - 1;
      uVar6 = 0xffffffff;
    }
  }
  else {
    iVar2 = atoi(pcVar1);
    if (iVar2 < 1) {
      if (iVar2 == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = (ulong)(uint)(iVar2 + (int)((ulong)((long)(this->vt).
                                                                                                                    
                                                  super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(this->vt).
                                                                                                                
                                                  super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3));
      }
    }
    else {
      uVar6 = (ulong)(iVar2 - 1);
    }
    sVar3 = strcspn(pcVar1,"/ \t\r");
    *token = pcVar1 + sVar3;
    if (pcVar1[sVar3] != '/') goto LAB_0013f7ea;
    pcVar7 = pcVar1 + sVar3 + 1;
    *token = pcVar7;
    iVar2 = atoi(pcVar7);
    if (iVar2 < 1) goto joined_r0x0013f7c8;
    uVar5 = iVar2 - 1;
  }
  sVar3 = strcspn(pcVar7," \t\r");
  *token = pcVar7 + sVar3;
LAB_0013f7ea:
  VVar8._0_8_ = (ulong)uVar4 | uVar6 << 0x20;
  VVar8.vn = uVar5;
  return VVar8;
}

Assistant:

Vertex OBJLoader::getUInt3(const char*& token)
  {
    Vertex v(-1);
    v.v = fix_v(atoi(token));
    token += strcspn(token, "/ \t\r");
    if (token[0] != '/') return(v);
    token++;

    // it is i//n
    if (token[0] == '/') {
      token++;
      v.vn = fix_vn(atoi(token));
      token += strcspn(token, " \t\r");
      return(v);
    }

    // it is i/t/n or i/t
    v.vt = fix_vt(atoi(token));
    token += strcspn(token, "/ \t\r");
    if (token[0] != '/') return(v);
    token++;

    // it is i/t/n
    v.vn = fix_vn(atoi(token));
    token += strcspn(token, " \t\r");
    return(v);
  }